

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O1

int64 google::protobuf::util::TimeUtil::DurationToMilliseconds(Duration *duration)

{
  long lVar1;
  
  lVar1 = (long)duration->nanos_;
  return lVar1 / 1000000 + duration->seconds_ * 1000 +
         (ulong)(0 < lVar1 % 1000000 && lVar1 < -999999);
}

Assistant:

int64 TimeUtil::DurationToMilliseconds(const Duration& duration) {
  return duration.seconds() * kMillisPerSecond +
         RoundTowardZero(duration.nanos(), kNanosPerMillisecond);
}